

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_decoder.cc
# Opt level: O2

int main(int argc,char **argv)

{
  string *file_name;
  byte bVar1;
  byte *pbVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  bool bVar5;
  int64_t iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  int iVar11;
  _Head_base<0UL,_draco::Mesh_*,_false> mesh;
  string extension;
  unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> local_230;
  vector<char,_std::allocator<char>_> data;
  Options options;
  CycleTimer timer;
  StatusOr<draco::EncodedGeometryType> type_statusor;
  DecoderBuffer buffer;
  Decoder decoder;
  StlEncoder stl_encoder;
  
  options.input._M_dataplus._M_p = (pointer)&options.input.field_2;
  options.input._M_string_length = 0;
  options.input.field_2._M_local_buf[0] = '\0';
  file_name = &options.output;
  options.output._M_dataplus._M_p = (pointer)&options.output.field_2;
  options.output._M_string_length = 0;
  options.output.field_2._M_local_buf[0] = '\0';
  for (iVar11 = 1; iVar11 < argc; iVar11 = iVar11 + 1) {
    pbVar2 = (byte *)argv[iVar11];
    bVar1 = *pbVar2;
    iVar7 = -(bVar1 - 0x2d);
    iVar9 = iVar7;
    if (bVar1 == 0x2d) {
      uVar8 = pbVar2[1] - 0x68;
      if (uVar8 == 0) {
        uVar8 = (uint)pbVar2[2];
      }
      if (uVar8 != 0) {
        uVar8 = pbVar2[1] - 0x3f;
        if (uVar8 == 0) {
          uVar8 = (uint)pbVar2[2];
        }
        iVar9 = -uVar8;
        goto LAB_00109e84;
      }
LAB_00109efd:
      anon_unknown.dwarf_8f91::Usage();
      iVar11 = 0;
      goto LAB_0010a190;
    }
LAB_00109e84:
    if (iVar9 == 0) goto LAB_00109efd;
    if (bVar1 == 0x2d) {
      uVar8 = pbVar2[1] - 0x69;
      if (uVar8 == 0) {
        uVar8 = (uint)pbVar2[2];
      }
      if (uVar8 != 0 || argc + -1 <= iVar11) {
        uVar8 = pbVar2[1] - 0x6f;
        if (uVar8 == 0) {
          uVar8 = (uint)pbVar2[2];
        }
        iVar7 = -uVar8;
        goto LAB_00109ec5;
      }
      std::__cxx11::string::assign((char *)&options);
LAB_00109edb:
      iVar11 = iVar11 + 1;
    }
    else {
LAB_00109ec5:
      if ((iVar7 == 0) && (iVar11 < argc + -1)) {
        std::__cxx11::string::assign((char *)file_name);
        goto LAB_00109edb;
      }
    }
  }
  if ((argc < 3) || (options.input._M_string_length == 0)) {
    anon_unknown.dwarf_8f91::Usage();
    iVar11 = -1;
    goto LAB_0010a190;
  }
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar4 = draco::ReadFileToBuffer(&options.input,&data);
  iVar11 = -1;
  if (bVar4) {
    if (data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pcVar10 = "Empty input file.";
      goto LAB_00109fc1;
    }
    draco::DecoderBuffer::DecoderBuffer(&buffer);
    draco::DecoderBuffer::Init
              (&buffer,data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
               (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    draco::Decoder::GetEncodedGeometryType(&type_statusor,&buffer);
    if (type_statusor.status_.code_ == OK) {
      if (type_statusor.value_ == POINT_CLOUD) {
        draco::DracoTimer::Start(&timer);
        draco::Decoder::Decoder(&decoder);
        draco::Decoder::DecodePointCloudFromBuffer
                  ((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                    *)&extension,&decoder,&buffer);
        if ((int)extension._M_dataplus._M_p == 0) {
          iVar11 = 0;
          draco::DracoTimer::Stop(&timer);
        }
        else {
          anon_unknown.dwarf_8f91::ReturnError((Status *)&extension);
          iVar11 = -1;
          local_230._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
          super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
          super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl =
               (__uniq_ptr_data<draco::Mesh,_std::default_delete<draco::Mesh>,_true,_true>)
               (__uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>)0x0;
        }
        draco::
        StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>::
        ~StatusOr((StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
                   *)&extension);
        draco::Decoder::~Decoder(&decoder);
        if ((int)extension._M_dataplus._M_p == 0) {
          mesh._M_head_impl = (Mesh *)0x0;
LAB_0010a0e5:
          if ((_Head_base<0UL,_draco::Mesh_*,_false>)
              local_230._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>.
              _M_t.super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
              super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl ==
              (_Head_base<0UL,_draco::Mesh_*,_false>)0x0) goto LAB_0010a14c;
          if (options.output._M_string_length == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &decoder,&options.input,".ply");
            std::__cxx11::string::operator=((string *)file_name,(string *)&decoder);
            std::__cxx11::string::~string((string *)&decoder);
          }
          if (options.output._M_string_length < 4) {
            std::__cxx11::string::string((string *)&decoder,(string *)file_name);
          }
          else {
            std::__cxx11::string::substr((ulong)&decoder,(ulong)file_name);
          }
          draco::parser::ToLower(&extension,(string *)&decoder);
          std::__cxx11::string::~string((string *)&decoder);
          bVar4 = std::operator==(&extension,".obj");
          if (bVar4) {
            draco::ObjEncoder::ObjEncoder((ObjEncoder *)&decoder);
            if (mesh._M_head_impl == (Mesh *)0x0) {
              bVar5 = draco::ObjEncoder::EncodeToFile
                                ((ObjEncoder *)&decoder,
                                 (PointCloud *)
                                 local_230._M_t.
                                 super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>
                                 .super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl,file_name
                                );
              bVar4 = true;
              if (!bVar5) {
                pcVar10 = "Failed to store the decoded point cloud as OBJ.";
                goto LAB_0010a316;
              }
            }
            else {
              bVar5 = draco::ObjEncoder::EncodeToFile
                                ((ObjEncoder *)&decoder,mesh._M_head_impl,file_name);
              bVar4 = true;
              if (!bVar5) {
                pcVar10 = "Failed to store the decoded mesh as OBJ.";
LAB_0010a316:
                puts(pcVar10);
                iVar11 = -1;
                bVar4 = false;
              }
            }
            draco::ObjEncoder::~ObjEncoder((ObjEncoder *)&decoder);
            if (bVar4) {
LAB_0010a331:
              _Var3._M_p = options.output._M_dataplus._M_p;
              iVar6 = draco::DracoTimer::GetInMs(&timer);
              iVar11 = 0;
              printf("Decoded geometry saved to %s (%ld ms to decode)\n",_Var3._M_p,iVar6);
            }
          }
          else {
            bVar4 = std::operator==(&extension,".ply");
            if (bVar4) {
              draco::PlyEncoder::PlyEncoder((PlyEncoder *)&decoder);
              if (mesh._M_head_impl == (Mesh *)0x0) {
                bVar4 = draco::PlyEncoder::EncodeToFile
                                  ((PlyEncoder *)&decoder,
                                   (PointCloud *)
                                   local_230._M_t.
                                   super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>
                                   .super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl,
                                   file_name);
                if (!bVar4) {
                  pcVar10 = "Failed to store the decoded point cloud as PLY.";
                  goto LAB_0010a38b;
                }
              }
              else {
                bVar4 = draco::PlyEncoder::EncodeToFile
                                  ((PlyEncoder *)&decoder,mesh._M_head_impl,file_name);
                if (!bVar4) {
                  pcVar10 = "Failed to store the decoded mesh as PLY.";
                  goto LAB_0010a38b;
                }
              }
              goto LAB_0010a331;
            }
            bVar4 = std::operator==(&extension,".stl");
            if (bVar4) {
              draco::StlEncoder::StlEncoder(&stl_encoder);
              if (mesh._M_head_impl != (Mesh *)0x0) {
                draco::StlEncoder::EncodeToFile
                          ((Status *)&decoder,&stl_encoder,mesh._M_head_impl,file_name);
                if (decoder.options_.global_options_.options_._M_t._M_impl._0_4_ != 0) {
                  puts("Failed to store the decoded mesh as STL.");
                  iVar11 = -1;
                }
                std::__cxx11::string::~string
                          ((string *)
                           &decoder.options_.global_options_.options_._M_t._M_impl.
                            super__Rb_tree_header);
                if (decoder.options_.global_options_.options_._M_t._M_impl._0_4_ == 0)
                goto LAB_0010a331;
                goto LAB_0010a393;
              }
              pcVar10 = "Can\'t store a point cloud as STL.";
            }
            else {
              pcVar10 = "Invalid output file extension. Use .obj .ply or .stl.";
            }
LAB_0010a38b:
            puts(pcVar10);
            iVar11 = -1;
          }
LAB_0010a393:
          std::__cxx11::string::~string((string *)&extension);
        }
      }
      else {
        if (type_statusor.value_ != TRIANGULAR_MESH) {
LAB_0010a14c:
          puts("Failed to decode the input file.");
          goto LAB_0010a158;
        }
        draco::DracoTimer::Start(&timer);
        draco::Decoder::Decoder(&decoder);
        draco::Decoder::DecodeMeshFromBuffer
                  ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                   &extension,&decoder,&buffer);
        if ((int)extension._M_dataplus._M_p == 0) {
          iVar11 = 0;
          draco::DracoTimer::Stop(&timer);
        }
        else {
          anon_unknown.dwarf_8f91::ReturnError((Status *)&extension);
          iVar11 = -1;
          local_230._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
          super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
          super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl =
               (__uniq_ptr_data<draco::Mesh,_std::default_delete<draco::Mesh>,_true,_true>)
               (__uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>)0x0;
        }
        draco::StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::~StatusOr
                  ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                   &extension);
        draco::Decoder::~Decoder(&decoder);
        mesh._M_head_impl =
             (Mesh *)local_230._M_t.
                     super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
                     super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
                     super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl;
        if ((int)extension._M_dataplus._M_p == 0) goto LAB_0010a0e5;
      }
    }
    else {
      anon_unknown.dwarf_8f91::ReturnError(&type_statusor.status_);
LAB_0010a158:
      iVar11 = -1;
      local_230._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
      super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
      super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl =
           (__uniq_ptr_data<draco::Mesh,_std::default_delete<draco::Mesh>,_true,_true>)
           (__uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>)0x0;
    }
    std::__cxx11::string::~string((string *)&type_statusor.status_.error_msg_);
    if ((_Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>)
        local_230._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
        super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
        super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl != (Mesh *)0x0) {
      (**(code **)(*(long *)local_230._M_t.
                            super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>
                            .super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl + 8))
                (local_230._M_t.
                 super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
                 super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
                 super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl);
    }
    draco::DecoderBuffer::BitDecoder::~BitDecoder(&buffer.bit_decoder_);
  }
  else {
    pcVar10 = "Failed opening the input file.";
LAB_00109fc1:
    puts(pcVar10);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&data.super__Vector_base<char,_std::allocator<char>_>);
LAB_0010a190:
  anon_unknown.dwarf_8f91::Options::~Options(&options);
  return iVar11;
}

Assistant:

int main(int argc, char **argv) {
  Options options;
  const int argc_check = argc - 1;

  for (int i = 1; i < argc; ++i) {
    if (!strcmp("-h", argv[i]) || !strcmp("-?", argv[i])) {
      Usage();
      return 0;
    } else if (!strcmp("-i", argv[i]) && i < argc_check) {
      options.input = argv[++i];
    } else if (!strcmp("-o", argv[i]) && i < argc_check) {
      options.output = argv[++i];
    }
  }
  if (argc < 3 || options.input.empty()) {
    Usage();
    return -1;
  }

  std::vector<char> data;
  if (!draco::ReadFileToBuffer(options.input, &data)) {
    printf("Failed opening the input file.\n");
    return -1;
  }

  if (data.empty()) {
    printf("Empty input file.\n");
    return -1;
  }

  // Create a draco decoding buffer. Note that no data is copied in this step.
  draco::DecoderBuffer buffer;
  buffer.Init(data.data(), data.size());

  draco::CycleTimer timer;
  // Decode the input data into a geometry.
  std::unique_ptr<draco::PointCloud> pc;
  draco::Mesh *mesh = nullptr;
  auto type_statusor = draco::Decoder::GetEncodedGeometryType(&buffer);
  if (!type_statusor.ok()) {
    return ReturnError(type_statusor.status());
  }
  const draco::EncodedGeometryType geom_type = type_statusor.value();
  if (geom_type == draco::TRIANGULAR_MESH) {
    timer.Start();
    draco::Decoder decoder;
    auto statusor = decoder.DecodeMeshFromBuffer(&buffer);
    if (!statusor.ok()) {
      return ReturnError(statusor.status());
    }
    std::unique_ptr<draco::Mesh> in_mesh = std::move(statusor).value();
    timer.Stop();
    if (in_mesh) {
      mesh = in_mesh.get();
      pc = std::move(in_mesh);
    }
  } else if (geom_type == draco::POINT_CLOUD) {
    // Failed to decode it as mesh, so let's try to decode it as a point cloud.
    timer.Start();
    draco::Decoder decoder;
    auto statusor = decoder.DecodePointCloudFromBuffer(&buffer);
    if (!statusor.ok()) {
      return ReturnError(statusor.status());
    }
    pc = std::move(statusor).value();
    timer.Stop();
  }

  if (pc == nullptr) {
    printf("Failed to decode the input file.\n");
    return -1;
  }

  if (options.output.empty()) {
    // Save the output model into a ply file.
    options.output = options.input + ".ply";
  }

  // Save the decoded geometry into a file.
  const std::string extension = draco::parser::ToLower(
      options.output.size() >= 4
          ? options.output.substr(options.output.size() - 4)
          : options.output);

  if (extension == ".obj") {
    draco::ObjEncoder obj_encoder;
    if (mesh) {
      if (!obj_encoder.EncodeToFile(*mesh, options.output)) {
        printf("Failed to store the decoded mesh as OBJ.\n");
        return -1;
      }
    } else {
      if (!obj_encoder.EncodeToFile(*pc, options.output)) {
        printf("Failed to store the decoded point cloud as OBJ.\n");
        return -1;
      }
    }
  } else if (extension == ".ply") {
    draco::PlyEncoder ply_encoder;
    if (mesh) {
      if (!ply_encoder.EncodeToFile(*mesh, options.output)) {
        printf("Failed to store the decoded mesh as PLY.\n");
        return -1;
      }
    } else {
      if (!ply_encoder.EncodeToFile(*pc, options.output)) {
        printf("Failed to store the decoded point cloud as PLY.\n");
        return -1;
      }
    }
  } else if (extension == ".stl") {
    draco::StlEncoder stl_encoder;
    if (mesh) {
      draco::Status s = stl_encoder.EncodeToFile(*mesh, options.output);
      if (s.code() != draco::Status::OK) {
        printf("Failed to store the decoded mesh as STL.\n");
        return -1;
      }
    } else {
      printf("Can't store a point cloud as STL.\n");
      return -1;
    }
  } else {
    printf("Invalid output file extension. Use .obj .ply or .stl.\n");
    return -1;
  }
  printf("Decoded geometry saved to %s (%" PRId64 " ms to decode)\n",
         options.output.c_str(), timer.GetInMs());
  return 0;
}